

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_cry_AppStoreReceipt.cpp
# Opt level: O3

bool axl::cry::verifyAppStoreReceipt
               (AppStoreReceipt *receipt,void *p,size_t size,void *computerGuid,
               size_t computerGuidSize,uint_t flags)

{
  undefined4 uVar1;
  uchar *puVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  char cVar5;
  BIO_METHOD *method;
  BUF_MEM *pBVar7;
  char *pcVar8;
  EVP_MD *type;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Bio bio;
  Pkcs7 pkcs7;
  X509Store store;
  Array<char,_axl::sl::ArrayDetails<char>_> message;
  uchar_t digest [20];
  AppStoreReceiptPayloadParser parser;
  char buffer [256];
  Handle<bio_st_*,_axl::cry::FreeBio,_axl::sl::Zero<bio_st_*>_> local_1d8;
  Handle<pkcs7_st_*,_axl::cry::FreePkcs7,_axl::sl::Zero<pkcs7_st_*>_> local_1d0;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> local_1c8;
  ArrayRef<char,_axl::sl::ArrayDetails<char>_> local_1b0;
  undefined1 local_198 [16];
  size_t local_188;
  uchar local_178;
  uchar uStack_177;
  uchar uStack_176;
  uchar uStack_175;
  uchar uStack_174;
  uchar uStack_173;
  uchar uStack_172;
  uchar uStack_171;
  uchar uStack_170;
  uchar uStack_16f;
  uchar uStack_16e;
  uchar uStack_16d;
  uchar uStack_16c;
  uchar uStack_16b;
  uchar uStack_16a;
  uchar uStack_169;
  undefined4 local_168;
  undefined1 local_158 [40];
  size_t local_130;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_128 [8];
  int iVar6;
  
  local_1d0.m_h = (pkcs7_st *)0x0;
  bVar4 = Pkcs7::loadDer((Pkcs7 *)&local_1d0,p,size);
  if (!bVar4) {
    bVar4 = false;
    goto LAB_00129995;
  }
  local_1d8.m_h = (bio_st *)0x0;
  method = BIO_s_mem();
  Bio::create((Bio *)&local_1d8,(BIO_METHOD *)method);
  if ((flags & 1) == 0) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_158._8_8_;
    local_158._0_16_ = auVar3 << 0x40;
    local_1c8.m_p = (ErrorHdr *)0x0;
    local_128[0].m_length = 0;
    local_128[0].m_isNullTerminated = false;
    local_128[0].m_p = (C *)0x0;
    local_128[0].m_hdr._0_1_ = 0;
    local_128[0].m_hdr._1_7_ = 0;
    sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::attachBufHdr
              (local_128,(BufHdr *)0x0);
    local_128[0].m_p =
         "-----BEGIN CERTIFICATE-----\nMIIEuzCCA6OgAwIBAgIBAjANBgkqhkiG9w0BAQUFADBiMQswCQYDVQQGEwJVUzET\nMBEGA1UEChMKQXBwbGUgSW5jLjEmMCQGA1UECxMdQXBwbGUgQ2VydGlmaWNhdGlv\nbiBBdXRob3JpdHkxFjAUBgNVBAMTDUFwcGxlIFJvb3QgQ0EwHhcNMDYwNDI1MjE0\nMDM2WhcNMzUwMjA5MjE0MDM2WjBiMQswCQYDVQQGEwJVUzETMBEGA1UEChMKQXBw\nbGUgSW5jLjEmMCQGA1UECxMdQXBwbGUgQ2VydGlmaWNhdGlvbiBBdXRob3JpdHkx\nFjAUBgNVBAMTDUFwcGxlIFJvb3QgQ0EwggEiMA0GCSqGSIb3DQEBAQUAA4IBDwAw\nggEKAoIBAQDkkakJH5HbHkdQ6wXtXnmELes2oldMVeyLGYne+Uts9QerIjAC6Bg+\n+FAJ039BqJj50cpmnCRrEdCju+QbKsMflZ56DKRHi1vUFjczy8QPTc4UadHJGXL1\nXQ7Vf1+b8iUDulWPTV0N8WQ1IxVLFVkds5T39pyez1C6wVhQZ48ItCD3y6wsIG9w\ntj8BMIy3Q88PnT3zK0koGsj+zrW5DtleHNbLPbU6rfQPDgCSC7EhFi501TwN22IW\nq6NxkkdTVcGvL0Gz+PvjcM3mo0xFfh9Ma1CWQYnEdGILEINBhzOKgbEwWOxaBDKM\naLOPHd5lc/9nXmW8Sdh2nzMUZaF3lMktAgMBAAGjggF6MIIBdjAOBgNVHQ8BAf8E\nBAMCAQYwDwYDVR0TAQH/BAUwAwEB/zAdBgNVHQ4EFgQUK9BpR5R2Cf70a40uQKb3\nR01/CF4wHwYDVR0jBBgwFoAUK9BpR5R2Cf70a40uQKb3R01/CF4wggERBgNVHSAE\nggEIMIIBBDCCAQAGCSqGSIb3Y2QFATCB8jAqBggrBgEFBQcCARYeaHR0cHM6Ly93\nd3cuYXBwbGUuY29tL2FwcGxlY2EvMIHDBggrBgEFBQcCAjCBthqBs1JlbGlhbmNl\nIG9uIHRoaXMgY2VydGlmaWNhdGUgYnkgYW55IHBhcnR5IGFzc3VtZXMgYWNjZXB0\nYW5jZSBvZiB0aGUgdGhlbiBhcHBsaWNhYmxlIHN0YW5kYXJkIHRlcm1zIGFuZCBj\nb25kaXRpb25zIG9mIHVzZSwgY2VydGlmaWNhdGUgcG9saWN5IGFuZCBjZXJ0aWZp\nY2F0aW9uIHByYWN0aWNlIHN0YXRlbWVudHMuMA0GCSqGSIb3DQEBBQUAA4IBAQBc\nNplMLXi37Yyb3PN3m/J20ncwT8EfhYOFG5k9RzfyqZtAjizUsZAS2L70c5vu0mQP\ny3lPNNiiPvl4/2vIB+x9OYOLUyDTOMSxv5pPCmv/K/xZpwUJfBdAVhEedNO3iyM7\nR6PVbyTi69G3cN8PReEnyvFteO3ntRcXqNx+IjXKJdXZD9Zr1KIkIxH3oayPc4Fg\nxhtbCS+SsvhESPBgOJ4V9T0mZyCKM2r3DYLP3uujL/lTaltkwGMzd/c6ByxW69oP\nIQ7aunMZT7XZNn/Bh1XZp5m5MkL72NVxnn6hUrcbvZNCJBIqxw8dtk2cXmPIS4AX\nUKqK1drk/NAJBzewdXUh\n-----END CERTIFICATE-----\n"
    ;
    local_128[0].m_length = 0x6a4;
    local_128[0].m_isNullTerminated = false;
    bVar4 = X509Cert::loadPem((X509Cert *)local_158,
                              "-----BEGIN CERTIFICATE-----\nMIIEuzCCA6OgAwIBAgIBAjANBgkqhkiG9w0BAQUFADBiMQswCQYDVQQGEwJVUzET\nMBEGA1UEChMKQXBwbGUgSW5jLjEmMCQGA1UECxMdQXBwbGUgQ2VydGlmaWNhdGlv\nbiBBdXRob3JpdHkxFjAUBgNVBAMTDUFwcGxlIFJvb3QgQ0EwHhcNMDYwNDI1MjE0\nMDM2WhcNMzUwMjA5MjE0MDM2WjBiMQswCQYDVQQGEwJVUzETMBEGA1UEChMKQXBw\nbGUgSW5jLjEmMCQGA1UECxMdQXBwbGUgQ2VydGlmaWNhdGlvbiBBdXRob3JpdHkx\nFjAUBgNVBAMTDUFwcGxlIFJvb3QgQ0EwggEiMA0GCSqGSIb3DQEBAQUAA4IBDwAw\nggEKAoIBAQDkkakJH5HbHkdQ6wXtXnmELes2oldMVeyLGYne+Uts9QerIjAC6Bg+\n+FAJ039BqJj50cpmnCRrEdCju+QbKsMflZ56DKRHi1vUFjczy8QPTc4UadHJGXL1\nXQ7Vf1+b8iUDulWPTV0N8WQ1IxVLFVkds5T39pyez1C6wVhQZ48ItCD3y6wsIG9w\ntj8BMIy3Q88PnT3zK0koGsj+zrW5DtleHNbLPbU6rfQPDgCSC7EhFi501TwN22IW\nq6NxkkdTVcGvL0Gz+PvjcM3mo0xFfh9Ma1CWQYnEdGILEINBhzOKgbEwWOxaBDKM\naLOPHd5lc/9nXmW8Sdh2nzMUZaF3lMktAgMBAAGjggF6MIIBdjAOBgNVHQ8BAf8E\nBAMCAQYwDwYDVR0TAQH/BAUwAwEB/zAdBgNVHQ4EFgQUK9BpR5R2Cf70a40uQKb3\nR01/CF4wHwYDVR0jBBgwFoAUK9BpR5R2Cf70a40uQKb3R01/CF4wggERBgNVHSAE\nggEIMIIBBDCCAQAGCSqGSIb3Y2QFATCB8jAqBggrBgEFBQcCARYeaHR0cHM6Ly93\nd3cuYXBwbGUuY29tL2FwcGxlY2EvMIHDBggrBgEFBQcCAjCBthqBs1JlbGlhbmNl\nIG9uIHRoaXMgY2VydGlmaWNhdGUgYnkgYW55IHBhcnR5IGFzc3VtZXMgYWNjZXB0\nYW5jZSBvZiB0aGUgdGhlbiBhcHBsaWNhYmxlIHN0YW5kYXJkIHRlcm1zIGFuZCBj\nb25kaXRpb25zIG9mIHVzZSwgY2VydGlmaWNhdGUgcG9saWN5IGFuZCBjZXJ0aWZp\nY2F0aW9uIHByYWN0aWNlIHN0YXRlbWVudHMuMA0GCSqGSIb3DQEBBQUAA4IBAQBc\nNplMLXi37Yyb3PN3m/J20ncwT8EfhYOFG5k9RzfyqZtAjizUsZAS2L70c5vu0mQP\ny3lPNNiiPvl4/2vIB+x9OYOLUyDTOMSxv5pPCmv/K/xZpwUJfBdAVhEedNO3iyM7\nR6PVbyTi69G3cN8PReEnyvFteO3ntRcXqNx+IjXKJdXZD9Zr1KIkIxH3oayPc4Fg\nxhtbCS+SsvhESPBgOJ4V9T0mZyCKM2r3DYLP3uujL/lTaltkwGMzd/c6ByxW69oP\nIQ7aunMZT7XZNn/Bh1XZp5m5MkL72NVxnn6hUrcbvZNCJBIqxw8dtk2cXmPIS4AX\nUKqK1drk/NAJBzewdXUh\n-----END CERTIFICATE-----\n"
                              ,0x6a4);
    if ((bVar4) && (bVar4 = X509Store::create((X509Store *)&local_1c8), bVar4)) {
      bVar4 = X509Store::addCert((X509Store *)&local_1c8,(X509 *)local_158._0_8_);
      if (!bVar4) goto LAB_001297c9;
      iVar6 = Pkcs7::verify((Pkcs7 *)&local_1d0,(EVP_PKEY_CTX *)0x0,(uchar *)local_1c8.m_p,0,
                            (uchar *)local_1d8.m_h,0);
      cVar5 = (char)iVar6;
    }
    else {
LAB_001297c9:
      cVar5 = '\0';
    }
    sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(local_128);
    sl::Handle<x509_store_st_*,_axl::cry::FreeX509Store,_axl::sl::Zero<x509_store_st_*>_>::~Handle
              ((Handle<x509_store_st_*,_axl::cry::FreeX509Store,_axl::sl::Zero<x509_store_st_*>_> *)
               &local_1c8);
    sl::Handle<x509_st_*,_axl::cry::FreeX509,_axl::sl::Zero<x509_st_*>_>::~Handle
              ((Handle<x509_st_*,_axl::cry::FreeX509,_axl::sl::Zero<x509_st_*>_> *)local_158);
    if (cVar5 == '\0') goto LAB_0012998a;
LAB_001297f9:
    pBVar7 = Bio::getBufMem((Bio *)&local_1d8);
    local_158._16_4_ = AttributeId_Undefined;
    local_158._24_16_ = (undefined1  [16])0x0;
    local_130 = 0;
    local_158._8_8_ = 0;
    local_158._0_8_ = receipt;
    pcVar8 = AppStoreReceiptPayloadParser::decode
                       ((AppStoreReceiptPayloadParser *)local_158,State_Set,0x11,
                        "invalid app receipt (expected ASN1 SET)",pBVar7->data,pBVar7->length);
    if (pcVar8 == (char *)0x0) goto LAB_0012998a;
    bVar4 = true;
    if ((flags & 2) == 0) {
      sl::Array<char,_axl::sl::ArrayDetails<char>_>::Array
                ((Array<char,_axl::sl::ArrayDetails<char>_> *)&local_1b0,BufKind_Exclusive,local_128
                 ,0x100);
      sl::Array<char,_axl::sl::ArrayDetails<char>_>::insert
                ((Array<char,_axl::sl::ArrayDetails<char>_> *)&local_1b0,0xffffffffffffffff,
                 (char *)computerGuid,computerGuidSize);
      sl::Array<char,_axl::sl::ArrayDetails<char>_>::insert
                ((Array<char,_axl::sl::ArrayDetails<char>_> *)&local_1b0,0xffffffffffffffff,
                 (receipt->m_opaque).super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.m_p,
                 (receipt->m_opaque).super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.m_count);
      sl::Array<char,_axl::sl::ArrayDetails<char>_>::insert
                ((Array<char,_axl::sl::ArrayDetails<char>_> *)&local_1b0,0xffffffffffffffff,
                 (receipt->m_rawBundleId).super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.m_p,
                 (receipt->m_rawBundleId).super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.m_count
                );
      type = EVP_sha1();
      EVP_Digest(local_1b0.m_p,local_1b0.m_count,&local_178,(uint *)0x0,type,(ENGINE *)0x0);
      if ((receipt->m_sha1Hash).super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.m_count == 0x14)
      {
        puVar2 = (uchar *)(receipt->m_sha1Hash).super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.
                          m_p;
        uVar1 = *(undefined4 *)(puVar2 + 0x10);
        auVar9[0] = -(*puVar2 == local_178);
        auVar9[1] = -(puVar2[1] == uStack_177);
        auVar9[2] = -(puVar2[2] == uStack_176);
        auVar9[3] = -(puVar2[3] == uStack_175);
        auVar9[4] = -(puVar2[4] == uStack_174);
        auVar9[5] = -(puVar2[5] == uStack_173);
        auVar9[6] = -(puVar2[6] == uStack_172);
        auVar9[7] = -(puVar2[7] == uStack_171);
        auVar9[8] = -(puVar2[8] == uStack_170);
        auVar9[9] = -(puVar2[9] == uStack_16f);
        auVar9[10] = -(puVar2[10] == uStack_16e);
        auVar9[0xb] = -(puVar2[0xb] == uStack_16d);
        auVar9[0xc] = -(puVar2[0xc] == uStack_16c);
        auVar9[0xd] = -(puVar2[0xd] == uStack_16b);
        auVar9[0xe] = -(puVar2[0xe] == uStack_16a);
        auVar9[0xf] = -(puVar2[0xf] == uStack_169);
        auVar10[0] = -((char)local_168 == (char)uVar1);
        auVar10[1] = -((char)((uint)local_168 >> 8) == (char)((uint)uVar1 >> 8));
        auVar10[2] = -((char)((uint)local_168 >> 0x10) == (char)((uint)uVar1 >> 0x10));
        auVar10[3] = -((char)((uint)local_168 >> 0x18) == (char)((uint)uVar1 >> 0x18));
        auVar10[4] = 0xff;
        auVar10[5] = 0xff;
        auVar10[6] = 0xff;
        auVar10[7] = 0xff;
        auVar10[8] = 0xff;
        auVar10[9] = 0xff;
        auVar10[10] = 0xff;
        auVar10[0xb] = 0xff;
        auVar10[0xc] = 0xff;
        auVar10[0xd] = 0xff;
        auVar10[0xe] = 0xff;
        auVar10[0xf] = 0xff;
        auVar9 = auVar9 & auVar10;
        if ((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar9[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0012992d;
        bVar4 = true;
      }
      else {
LAB_0012992d:
        err::Error::Error((Error *)&local_1c8,"app receipt SHA1 hash mismatch");
        local_198 = (undefined1  [16])0x0;
        local_188 = 0;
        rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::move
                  ((BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> *)local_198,&local_1c8);
        rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_1c8);
        err::setError((ErrorRef *)local_198);
        rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release
                  ((BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> *)local_198);
        bVar4 = false;
      }
      sl::ArrayRef<char,_axl::sl::ArrayDetails<char>_>::release(&local_1b0);
    }
  }
  else {
    iVar6 = Pkcs7::verify((Pkcs7 *)&local_1d0,(EVP_PKEY_CTX *)0x0,(uchar *)0x0,0,
                          (uchar *)local_1d8.m_h,0x24);
    if ((char)iVar6 != '\0') goto LAB_001297f9;
LAB_0012998a:
    bVar4 = false;
  }
  sl::Handle<bio_st_*,_axl::cry::FreeBio,_axl::sl::Zero<bio_st_*>_>::~Handle(&local_1d8);
LAB_00129995:
  sl::Handle<pkcs7_st_*,_axl::cry::FreePkcs7,_axl::sl::Zero<pkcs7_st_*>_>::~Handle(&local_1d0);
  return bVar4;
}

Assistant:

bool
verifyAppStoreReceipt(
	AppStoreReceipt* receipt,
	const void* p,
	size_t size,
	const void* computerGuid,
	size_t computerGuidSize,
	uint_t flags
) {
	static const char appleRootCertPem[] =
		"-----BEGIN CERTIFICATE-----\n"
		"MIIEuzCCA6OgAwIBAgIBAjANBgkqhkiG9w0BAQUFADBiMQswCQYDVQQGEwJVUzET\n"
		"MBEGA1UEChMKQXBwbGUgSW5jLjEmMCQGA1UECxMdQXBwbGUgQ2VydGlmaWNhdGlv\n"
		"biBBdXRob3JpdHkxFjAUBgNVBAMTDUFwcGxlIFJvb3QgQ0EwHhcNMDYwNDI1MjE0\n"
		"MDM2WhcNMzUwMjA5MjE0MDM2WjBiMQswCQYDVQQGEwJVUzETMBEGA1UEChMKQXBw\n"
		"bGUgSW5jLjEmMCQGA1UECxMdQXBwbGUgQ2VydGlmaWNhdGlvbiBBdXRob3JpdHkx\n"
		"FjAUBgNVBAMTDUFwcGxlIFJvb3QgQ0EwggEiMA0GCSqGSIb3DQEBAQUAA4IBDwAw\n"
		"ggEKAoIBAQDkkakJH5HbHkdQ6wXtXnmELes2oldMVeyLGYne+Uts9QerIjAC6Bg+\n"
		"+FAJ039BqJj50cpmnCRrEdCju+QbKsMflZ56DKRHi1vUFjczy8QPTc4UadHJGXL1\n"
		"XQ7Vf1+b8iUDulWPTV0N8WQ1IxVLFVkds5T39pyez1C6wVhQZ48ItCD3y6wsIG9w\n"
		"tj8BMIy3Q88PnT3zK0koGsj+zrW5DtleHNbLPbU6rfQPDgCSC7EhFi501TwN22IW\n"
		"q6NxkkdTVcGvL0Gz+PvjcM3mo0xFfh9Ma1CWQYnEdGILEINBhzOKgbEwWOxaBDKM\n"
		"aLOPHd5lc/9nXmW8Sdh2nzMUZaF3lMktAgMBAAGjggF6MIIBdjAOBgNVHQ8BAf8E\n"
		"BAMCAQYwDwYDVR0TAQH/BAUwAwEB/zAdBgNVHQ4EFgQUK9BpR5R2Cf70a40uQKb3\n"
		"R01/CF4wHwYDVR0jBBgwFoAUK9BpR5R2Cf70a40uQKb3R01/CF4wggERBgNVHSAE\n"
		"ggEIMIIBBDCCAQAGCSqGSIb3Y2QFATCB8jAqBggrBgEFBQcCARYeaHR0cHM6Ly93\n"
		"d3cuYXBwbGUuY29tL2FwcGxlY2EvMIHDBggrBgEFBQcCAjCBthqBs1JlbGlhbmNl\n"
		"IG9uIHRoaXMgY2VydGlmaWNhdGUgYnkgYW55IHBhcnR5IGFzc3VtZXMgYWNjZXB0\n"
		"YW5jZSBvZiB0aGUgdGhlbiBhcHBsaWNhYmxlIHN0YW5kYXJkIHRlcm1zIGFuZCBj\n"
		"b25kaXRpb25zIG9mIHVzZSwgY2VydGlmaWNhdGUgcG9saWN5IGFuZCBjZXJ0aWZp\n"
		"Y2F0aW9uIHByYWN0aWNlIHN0YXRlbWVudHMuMA0GCSqGSIb3DQEBBQUAA4IBAQBc\n"
		"NplMLXi37Yyb3PN3m/J20ncwT8EfhYOFG5k9RzfyqZtAjizUsZAS2L70c5vu0mQP\n"
		"y3lPNNiiPvl4/2vIB+x9OYOLUyDTOMSxv5pPCmv/K/xZpwUJfBdAVhEedNO3iyM7\n"
		"R6PVbyTi69G3cN8PReEnyvFteO3ntRcXqNx+IjXKJdXZD9Zr1KIkIxH3oayPc4Fg\n"
		"xhtbCS+SsvhESPBgOJ4V9T0mZyCKM2r3DYLP3uujL/lTaltkwGMzd/c6ByxW69oP\n"
		"IQ7aunMZT7XZNn/Bh1XZp5m5MkL72NVxnn6hUrcbvZNCJBIqxw8dtk2cXmPIS4AX\n"
		"UKqK1drk/NAJBzewdXUh\n"
		"-----END CERTIFICATE-----\n";

	Pkcs7 pkcs7;
	bool result = pkcs7.loadDer(p, size);
	if (!result)
		return false;

	Bio bio;
	bio.createMem();

	if (flags & VerifyAppStoreReceiptFlag_SkipSignatureCheck) {
		result = pkcs7.verify(NULL, NULL, NULL, bio, PKCS7_NOVERIFY | PKCS7_NOSIGS);
	} else {
		X509Cert appleRootCert;
		X509Store store;

		result =
			appleRootCert.loadPem(sl::StringRef(appleRootCertPem, lengthof(appleRootCertPem))) &&
			store.create() &&
			store.addCert(appleRootCert) &&
			pkcs7.verify(NULL, store, NULL, bio, 0);
	}

	if (!result)
		return false;

	BUF_MEM* bufMem = bio.getBufMem();

	AppStoreReceiptPayloadParser parser;
	result = parser.parse(receipt, bufMem->data, bufMem->length);
	if (!result)
		return false;

	if (flags & VerifyAppStoreReceiptFlag_SkipHashCheck)
		return true;

	char buffer[256];
	sl::Array<char> message(rc::BufKind_Stack, buffer, sizeof(buffer));
	message.append((char*)computerGuid, computerGuidSize);
	message.append(receipt->m_opaque, receipt->m_opaque.getCount());
	message.append(receipt->m_rawBundleId, receipt->m_rawBundleId.getCount());

	uchar_t digest[20];
	EVP_Digest(message, message.getCount(), digest, NULL, EVP_sha1(), NULL);

	bool isMatch =
		receipt->m_sha1Hash.getCount() == sizeof(digest) &&
		memcmp(receipt->m_sha1Hash, digest, sizeof(digest)) == 0;

	if (!isMatch)
		return err::fail("app receipt SHA1 hash mismatch");

	return true;
}